

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

void __thiscall MemoryLeakDetector::invalidateMemory(MemoryLeakDetector *this,char *memory)

{
  MemoryLeakDetectorNode *pMVar1;
  
  pMVar1 = MemoryLeakDetectorTable::retrieveNode(&this->memoryTable_,memory);
  if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    (*PlatformSpecificMemset)(memory,0xcd,*(size_t *)pMVar1);
    return;
  }
  return;
}

Assistant:

void MemoryLeakDetector::invalidateMemory(char* memory)
{
#ifndef CPPUTEST_DISABLE_HEAP_POISON
  MemoryLeakDetectorNode* node = memoryTable_.retrieveNode(memory);
  if (node)
    PlatformSpecificMemset(memory, 0xCD, node->size_);
#endif
}